

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromecast.h
# Opt level: O2

bool cc::sendSimple(Connection *conn,Type type,Namespace urn)

{
  int __val;
  bool bVar1;
  undefined1 uVar2;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar2 = s_verbose;
  if ((int)type < 5 && (int)urn < 4) {
    if (type == GetStatus) {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              mediaSession_abi_cxx11_,"");
      uVar2 = s_verbose;
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"urn:x-cast:com.google.cast.media",&local_e1);
        __val = s_requestId;
        s_requestId = s_requestId + 1;
        std::__cxx11::to_string(&local_60,__val);
        std::operator+(&local_40,"{  \"type\": \"GET_STATUS\",  \"requestId\": ",&local_60);
        std::operator+(&local_a0,&local_40,",  \"mediaSessionId\": \"");
        std::operator+(&local_80,&local_a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       mediaSession_abi_cxx11_);
        std::operator+(&local_e0,&local_80,"\"}");
        bVar1 = sendMessage(conn,&local_c0,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_c0);
        return bVar1;
      }
    }
    else if (type - Ping < 2) {
      s_verbose = false;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               _ZN2cc2nsL7stringsE_rel + *(int *)(_ZN2cc2nsL7stringsE_rel + (ulong)urn * 4),
               (allocator<char> *)&local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,
               _ZZN2cc10sendSimpleERK10ConnectionNS_3msg4TypeENS_2ns9NamespaceEE4msgs_rel +
               *(int *)(_ZZN2cc10sendSimpleERK10ConnectionNS_3msg4TypeENS_2ns9NamespaceEE4msgs_rel +
                       (ulong)type * 4),(allocator<char> *)&local_a0);
    bVar1 = sendMessage(conn,&local_c0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    s_verbose = (bool)uVar2;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool sendSimple(const Connection &conn, const msg::Type type, const ns::Namespace urn)
{
    static const char *msgs[msg::SimpleMessageCount] = {
        "{\"type\": \"CONNECT\"}",
        "{\"type\": \"PING\"}",
        "{\"type\": \"PONG\"}",
        "{\"type\": \"GET_STATUS\", \"requestId\": 1}",
        "{\"type\": \"MEDIA_STATUS\"}"
    };

    if (urn >= ns::NamespacesCount) {
        return false;
    }
    if (type >= msg::SimpleMessageCount) {
        return false;
    }
    if (type == msg::GetStatus && mediaSession != "") {
        return sendMessage(conn,
                ns::strings[ns::Media],
                "{ "
                " \"type\": \"GET_STATUS\", "
                " \"requestId\": " + std::to_string(s_requestId++) + ", "
                " \"mediaSessionId\": \"" + mediaSession + "\""
                "}"
            );
    }

    const bool wasVerbose = s_verbose;
    if (type == msg::Ping || type == msg::Pong) {
        // too much spam
        s_verbose = false;
    }
    const bool ret = sendMessage(conn, ns::strings[urn], msgs[type]);
    s_verbose = wasVerbose;
    return ret;
}